

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SequenceDistanceGraphPath.cc
# Opt level: O2

bool __thiscall
SequenceDistanceGraphPath::operator==
          (SequenceDistanceGraphPath *this,SequenceDistanceGraphPath *rhs)

{
  bool bVar1;
  _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> _Stack_68;
  _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> local_38;
  
  make_set_of_nodes((set<long,_std::less<long>,_std::allocator<long>_> *)&local_38,this);
  make_set_of_nodes((set<long,_std::less<long>,_std::allocator<long>_> *)&_Stack_68,rhs);
  bVar1 = std::operator==(&local_38,&_Stack_68);
  std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::~_Rb_tree
            (&_Stack_68);
  std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::~_Rb_tree
            (&local_38);
  return bVar1;
}

Assistant:

bool SequenceDistanceGraphPath::operator==(const SequenceDistanceGraphPath& rhs) const {
    return make_set_of_nodes() == rhs.make_set_of_nodes();
}